

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O1

nk_context * nk_glfw3_init(GLFWwindow *win,nk_glfw_init_state init_state)

{
  nk_handle local_40;
  code *local_38;
  code *local_30;
  
  glfw.win = win;
  if (init_state == NK_GLFW3_INSTALL_CALLBACKS) {
    glfwSetScrollCallback(win,nk_gflw3_scroll_callback);
    glfwSetCharCallback(win,nk_glfw3_char_callback);
  }
  local_40.ptr = (void *)0x0;
  local_38 = nk_malloc;
  local_30 = nk_mfree;
  nk_init(&glfw.ctx,(nk_allocator *)&local_40,(nk_user_font *)0x0);
  glfw.ctx.clip.copy = nk_glfw3_clipbard_copy;
  glfw.ctx.clip.paste = nk_glfw3_clipbard_paste;
  glfw.ctx.clip.userdata.ptr = (void *)0x0;
  glfw.ogl.cmds.pool.free = (nk_plugin_free)0x0;
  glfw.ogl.cmds.marker[0] = (nk_buffer_marker)ZEXT816(0);
  glfw.ogl.cmds.marker[1] = (nk_buffer_marker)ZEXT816(0);
  glfw.ogl.cmds.pool.userdata.ptr = (void *)0x0;
  glfw.ogl.cmds.pool.alloc = (nk_plugin_alloc)0x0;
  glfw.ogl.cmds.memory = (nk_memory)ZEXT816(0);
  glfw.ogl.cmds.grow_factor = 0.0;
  glfw.ogl.cmds._84_4_ = 0;
  glfw.ogl.cmds.allocated = 0;
  glfw.ogl.cmds.needed = 0;
  glfw.ogl.cmds.calls = 0;
  glfw.ogl.cmds.size = 0;
  glfw.ogl.cmds.type = NK_BUFFER_DYNAMIC;
  glfw.ogl.cmds._60_4_ = 0;
  glfw.ogl.cmds.memory.ptr = malloc(0x1000);
  glfw.ogl.cmds.memory.size = 0x1000;
  glfw.ogl.cmds.size = 0x1000;
  glfw.ogl.cmds.grow_factor = 2.0;
  glfw.ogl.cmds.pool.userdata.ptr = (void *)0x0;
  glfw.ogl.cmds.pool.alloc = nk_malloc;
  glfw.ogl.cmds.pool.free = nk_mfree;
  return &glfw.ctx;
}

Assistant:

NK_API struct nk_context*
nk_glfw3_init(GLFWwindow *win, enum nk_glfw_init_state init_state)
{
    glfw.win = win;
    if (init_state == NK_GLFW3_INSTALL_CALLBACKS) {
        glfwSetScrollCallback(win, nk_gflw3_scroll_callback);
        glfwSetCharCallback(win, nk_glfw3_char_callback);
    }

    nk_init_default(&glfw.ctx, 0);
    glfw.ctx.clip.copy = nk_glfw3_clipbard_copy;
    glfw.ctx.clip.paste = nk_glfw3_clipbard_paste;
    glfw.ctx.clip.userdata = nk_handle_ptr(0);
    nk_buffer_init_default(&glfw.ogl.cmds);
    return &glfw.ctx;
}